

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O0

void intgemm::TestMultiplyRelu<intgemm::SSSE3::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndWriteRelu callback;
  ostream *poVar1;
  char *pcVar2;
  float *pfVar3;
  float *pfVar4;
  anon_class_8_1_19531403 callback_00;
  float *pfVar5;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar6;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe8d8;
  Index cols;
  uniform_real_distribution<float> *in_stack_ffffffffffffe8e0;
  int8_t *in_stack_ffffffffffffe8e8;
  AlignedVector<float> *in_stack_ffffffffffffe8f0;
  AlignedVector<float> *pAVar7;
  char *in_stack_ffffffffffffe8f8;
  char *in_stack_ffffffffffffe900;
  float *in_stack_ffffffffffffe908;
  float *in_stack_ffffffffffffe910;
  undefined8 in_stack_ffffffffffffe918;
  Index IVar8;
  undefined8 in_stack_ffffffffffffe920;
  int8_t *in_stack_ffffffffffffe928;
  float *in_stack_ffffffffffffe930;
  Index in_stack_ffffffffffffe940;
  float fVar9;
  string local_1640 [40];
  AlignedVector<float> local_1618;
  float *local_1608;
  AlignedVector<float> local_1600;
  AlignedVector<signed_char> local_15f0;
  UnquantizeAndWriteRelu local_15e0;
  AlignedVector<float> local_15d0;
  AlignedVector<signed_char> local_15c0;
  AlignedVector<signed_char> local_15b0;
  float local_15a0;
  float local_159c;
  float *local_1598;
  float *local_1590;
  float *local_1588;
  AlignedVector<float> *local_1580;
  float *local_1578;
  float *local_1570;
  float *local_1568;
  AlignedVector<float> *local_1560;
  float in_stack_fffffffffffff0c0;
  float in_stack_fffffffffffff0c4;
  float in_stack_fffffffffffff0c8;
  float in_stack_fffffffffffff0cc;
  string *in_stack_fffffffffffff0d0;
  size_t in_stack_fffffffffffff0d8;
  float *in_stack_fffffffffffff0e0;
  float *in_stack_fffffffffffff0e8;
  float *in_stack_fffffffffffff0f0;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"8-bit SSSE3");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe8f0,(size_t)in_stack_ffffffffffffe8e8,
             (size_t)in_stack_ffffffffffffe8e0);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe8f0,(size_t)in_stack_ffffffffffffe8e8,
             (size_t)in_stack_ffffffffffffe8e0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x21da52);
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffe8e0,(float)((ulong)in_stack_ffffffffffffe8d8 >> 0x20),
             SUB84(in_stack_ffffffffffffe8d8,0));
  local_1560 = local_1b8;
  local_1568 = AlignedVector<float>::begin(local_1560);
  local_1570 = AlignedVector<float>::end(local_1560);
  for (; local_1568 != local_1570; local_1568 = local_1568 + 1) {
    local_1578 = local_1568;
    rVar6 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8);
    *local_1578 = rVar6;
  }
  local_1580 = &local_1c8;
  local_1588 = AlignedVector<float>::begin(local_1580);
  local_1590 = AlignedVector<float>::end(local_1580);
  for (; IVar8 = (Index)((ulong)in_stack_ffffffffffffe918 >> 0x20), local_1588 != local_1590;
      local_1588 = local_1588 + 1) {
    local_1598 = local_1588;
    rVar6 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8);
    *local_1598 = rVar6;
  }
  local_159c = 64.0;
  local_15a0 = 0.00024414062;
  AlignedVector<float>::size(local_1b8);
  cols = (Index)((ulong)in_stack_ffffffffffffe8d8 >> 0x20);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe8f0,
             (size_t)in_stack_ffffffffffffe8e8,(size_t)in_stack_ffffffffffffe8e0);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe8f0,
             (size_t)in_stack_ffffffffffffe8e8,(size_t)in_stack_ffffffffffffe8e0);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<signed_char>::begin(&local_15b0);
  SSSE3::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
             (float)((ulong)in_stack_ffffffffffffe8e0 >> 0x20),(Index)in_stack_ffffffffffffe8e0,cols
            );
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_15c0);
  SSSE3::Kernels8::PrepareB
            (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,
             (float)((ulong)in_stack_ffffffffffffe920 >> 0x20),(Index)in_stack_ffffffffffffe920,
             IVar8);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe8f0,(size_t)in_stack_ffffffffffffe8e8,
             (size_t)in_stack_ffffffffffffe8e0);
  pcVar2 = AlignedVector<signed_char>::begin(&local_15b0);
  pfVar3 = (float *)AlignedVector<signed_char>::begin(&local_15c0);
  fVar9 = local_15a0;
  pfVar4 = AlignedVector<float>::begin(&local_15d0);
  callbacks::UnquantizeAndWriteRelu::UnquantizeAndWriteRelu(&local_15e0,fVar9,pfVar4);
  callback.output_addr = in_stack_ffffffffffffe910;
  callback._0_8_ = in_stack_ffffffffffffe908;
  OMPParallelWrap<intgemm::callbacks::UnquantizeAndWriteRelu,intgemm::SSSE3::Kernels8,signed_char>
            (in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
             (Index)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),(Index)in_stack_ffffffffffffe8f0,
             (Index)((ulong)in_stack_ffffffffffffe8e8 >> 0x20),callback);
  IVar8 = (Index)((ulong)in_stack_ffffffffffffe8f8 >> 0x20);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe8f0,
             (size_t)in_stack_ffffffffffffe8e8,(size_t)in_stack_ffffffffffffe8e0);
  pAVar7 = &local_1c8;
  AlignedVector<float>::begin(pAVar7);
  AlignedVector<signed_char>::begin(&local_15f0);
  fVar9 = local_159c;
  AlignedVector<float>::size(pAVar7);
  SSSE3::Kernels8::Quantize(pfVar3,pcVar2,fVar9,in_stack_ffffffffffffe940);
  AlignedVector<float>::size(&local_15d0);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe8f0,(size_t)in_stack_ffffffffffffe8e8,
             (size_t)in_stack_ffffffffffffe8e0);
  pcVar2 = AlignedVector<signed_char>::begin(&local_15b0);
  callback_00.unquant_mult = (float *)AlignedVector<signed_char>::begin(&local_15f0);
  AlignedVector<float>::begin(&local_1600);
  local_1608 = &local_15a0;
  references::
  Multiply<signed_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:355:99),_nullptr>
            (pcVar2,(char *)in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
             (Index)((ulong)in_stack_ffffffffffffe900 >> 0x20),(Index)in_stack_ffffffffffffe900,
             IVar8,callback_00);
  AlignedVector<float>::size(&local_15d0);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe8f0,(size_t)in_stack_ffffffffffffe8e8,
             (size_t)in_stack_ffffffffffffe8e0);
  pfVar3 = AlignedVector<float>::begin(local_1b8);
  pfVar4 = AlignedVector<float>::begin(&local_1c8);
  pfVar5 = AlignedVector<float>::begin(&local_1618);
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:361:86),_nullptr>
            (pfVar3,pfVar4,pfVar5,local_4,local_8,local_c);
  AlignedVector<float>::begin(&local_1618);
  AlignedVector<float>::begin(&local_1600);
  pAVar7 = &local_15d0;
  AlignedVector<float>::begin(pAVar7);
  AlignedVector<float>::size(pAVar7);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0,
             in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
             in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_1640);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21e061);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21e06e);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x21e07b);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21e088);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x21e095);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x21e0a2);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21e0af);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21e0bc);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyRelu(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);
  OMPParallelWrap<callbacks::UnquantizeAndWriteRelu, Routine>(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndWriteRelu(unquant_mult, test_C.begin()));
  // Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::Sequence(
  //   callbacks::Unquantize(unquant_mult),
  //   callbacks::Write<float>(test_C.begin())
  // ));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo&) {
    float ret = std::max(0.0f, sum * unquant_mult);
    return ret;
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo&) {
    return static_cast<float>(std::max(0.0,sum));
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}